

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O2

int __thiscall
glcts::TextureCubeMapArraySamplingTest::programDefinition::link
          (programDefinition *this,char *__from,char *__to)

{
  GLenum GVar1;
  undefined8 extraout_RAX;
  GLuint program_object_id;
  GLint linkStatus;
  GLint local_1c;
  
  program_object_id = this->m_program_object_id;
  if (program_object_id != 0) {
    if (this->compute_shader != (shaderDefinition *)0x0) {
      shaderDefinition::attach(this->compute_shader,program_object_id);
      program_object_id = this->m_program_object_id;
    }
    if (this->geometry_shader != (shaderDefinition *)0x0) {
      shaderDefinition::attach(this->geometry_shader,program_object_id);
      program_object_id = this->m_program_object_id;
    }
    if (this->fragment_shader != (shaderDefinition *)0x0) {
      shaderDefinition::attach(this->fragment_shader,program_object_id);
      program_object_id = this->m_program_object_id;
    }
    if (this->tesselation_control_shader != (shaderDefinition *)0x0) {
      shaderDefinition::attach(this->tesselation_control_shader,program_object_id);
      program_object_id = this->m_program_object_id;
    }
    if (this->tesselation_evaluation_shader != (shaderDefinition *)0x0) {
      shaderDefinition::attach(this->tesselation_evaluation_shader,program_object_id);
      program_object_id = this->m_program_object_id;
    }
    if (this->vertex_shader != (shaderDefinition *)0x0) {
      shaderDefinition::attach(this->vertex_shader,program_object_id);
      program_object_id = this->m_program_object_id;
    }
    (*this->m_gl->linkProgram)(program_object_id);
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glLinkProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                    ,0x11c9);
    local_1c = 0;
    (*this->m_gl->getProgramiv)(this->m_program_object_id,0x8b82,&local_1c);
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glGetProgramiv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                    ,0x11ce);
    return (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),local_1c != 0);
  }
  return 0;
}

Assistant:

bool TextureCubeMapArraySamplingTest::programDefinition::link()
{
	if (m_invalid_program_object_id == m_program_object_id)
	{
		return false;
	}

	if (0 != compute_shader)
	{
		compute_shader->attach(m_program_object_id);
	}

	if (0 != geometry_shader)
	{
		geometry_shader->attach(m_program_object_id);
	}

	if (0 != fragment_shader)
	{
		fragment_shader->attach(m_program_object_id);
	}

	if (0 != tesselation_control_shader)
	{
		tesselation_control_shader->attach(m_program_object_id);
	}

	if (0 != tesselation_evaluation_shader)
	{
		tesselation_evaluation_shader->attach(m_program_object_id);
	}

	if (0 != vertex_shader)
	{
		vertex_shader->attach(m_program_object_id);
	}

	/* Link Program */
	m_gl->linkProgram(m_program_object_id);
	GLU_EXPECT_NO_ERROR(m_gl->getError(), "glLinkProgram() call failed.");

	/* Check linking status */
	glw::GLint linkStatus = GL_FALSE;
	m_gl->getProgramiv(m_program_object_id, GL_LINK_STATUS, &linkStatus);
	GLU_EXPECT_NO_ERROR(m_gl->getError(), "glGetProgramiv() call failed.");

	if (linkStatus == GL_FALSE)
	{
		return false;
	}

	return true;
}